

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

void __thiscall duckdb::SleepCommand::ExecuteInternal(SleepCommand *this,ExecuteContext *context)

{
  idx_t iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  runtime_error *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  timespec local_20;
  
  switch(this->unit) {
  case NANOSECOND:
    iVar1 = this->duration;
    if (iVar1 != 0) {
      auVar5._8_4_ = (int)(iVar1 >> 0x20);
      auVar5._0_8_ = iVar1;
      auVar5._12_4_ = 0x45300000;
      dVar9 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
      local_20.tv_sec = (__time_t)(dVar9 / 1000000000.0);
      local_20.tv_nsec = (long)(dVar9 - (double)local_20.tv_sec * 1000000000.0);
      do {
        iVar2 = nanosleep(&local_20,&local_20);
        if (iVar2 != -1) {
          return;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    break;
  case MICROSECOND:
    iVar1 = this->duration;
    if (iVar1 != 0) {
      auVar8._8_4_ = (int)(iVar1 >> 0x20);
      auVar8._0_8_ = iVar1;
      auVar8._12_4_ = 0x45300000;
      dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
      local_20.tv_sec = (__time_t)(dVar9 / 1000000.0);
      local_20.tv_nsec = (long)((dVar9 - (double)local_20.tv_sec * 1000000.0) * 1000.0);
      do {
        iVar2 = nanosleep(&local_20,&local_20);
        if (iVar2 != -1) {
          return;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    break;
  case MILLISECOND:
    iVar1 = this->duration;
    if (iVar1 != 0) {
      auVar6._8_4_ = (int)(iVar1 >> 0x20);
      auVar6._0_8_ = iVar1;
      auVar6._12_4_ = 0x45300000;
      dVar9 = (auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
      local_20.tv_sec = (__time_t)(dVar9 / 1000.0);
      local_20.tv_nsec = (long)((dVar9 - (double)local_20.tv_sec * 1000.0) * 1000000.0);
      do {
        iVar2 = nanosleep(&local_20,&local_20);
        if (iVar2 != -1) {
          return;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    break;
  case SECOND:
    lVar3 = this->duration * 1000;
    if (lVar3 != 0) {
      auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar7._0_8_ = lVar3;
      auVar7._12_4_ = 0x45300000;
      dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      local_20.tv_sec = (__time_t)(dVar9 / 1000.0);
      local_20.tv_nsec = (long)((dVar9 - (double)local_20.tv_sec * 1000.0) * 1000000.0);
      do {
        iVar2 = nanosleep(&local_20,&local_20);
        if (iVar2 != -1) {
          return;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unrecognized sleep unit");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SleepCommand::ExecuteInternal(ExecuteContext &context) const {
	switch (unit) {
	case SleepUnit::NANOSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::nano>(duration));
		break;
	case SleepUnit::MICROSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(duration));
		break;
	case SleepUnit::MILLISECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration));
		break;
	case SleepUnit::SECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration * 1000));
		break;
	default:
		throw std::runtime_error("Unrecognized sleep unit");
	}
}